

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

document_iterator __thiscall llvm::yaml::Stream::begin(Stream *this)

{
  bool bVar1;
  pointer this_00;
  Document *this_01;
  Token local_50;
  Stream *local_18;
  Stream *this_local;
  
  local_18 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CurrentDoc);
  if (!bVar1) {
    this_00 = std::unique_ptr<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>::
              operator->(&this->scanner);
    yaml::Scanner::getNext(&local_50,this_00);
    Token::~Token(&local_50);
    this_01 = (Document *)operator_new(0xa8);
    Document::Document(this_01,this);
    std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::reset
              (&this->CurrentDoc,this_01);
    document_iterator::document_iterator((document_iterator *)&this_local,&this->CurrentDoc);
    return (document_iterator)
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
           this_local;
  }
  report_fatal_error("Can only iterate over the stream once",true);
}

Assistant:

document_iterator Stream::begin() {
  if (CurrentDoc)
    report_fatal_error("Can only iterate over the stream once");

  // Skip Stream-Start.
  scanner->getNext();

  CurrentDoc.reset(new Document(*this));
  return document_iterator(CurrentDoc);
}